

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::skip_escape(CTcTokenizer *this,utf8_ptr *p)

{
  wchar_t wVar1;
  CTcTokenizer *this_00;
  utf8_ptr dst;
  char buf [10];
  utf8_ptr local_20;
  char local_12 [10];
  
  this_00 = (CTcTokenizer *)p;
  wVar1 = utf8_ptr::getch(p);
  if (wVar1 == L'\\') {
    local_20.p_ = local_12;
    xlat_escape(this_00,&local_20,p,L'\0',0);
    return;
  }
  utf8_ptr::inc(p);
  return;
}

Assistant:

void CTcTokenizer::skip_escape(utf8_ptr *p)
{
    if (p->getch() == '\\')
    {
        /* translate an escape into an empty buffer */
        char buf[10];
        utf8_ptr dst(buf);
        xlat_escape(&dst, p, 0, FALSE);
    }
    else
    {
        /* just skip the character */
        p->inc();
    }
}